

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_finite_gt.cpp
# Opt level: O3

void __thiscall
AFHFreeEnergyTest_Chain1_Test::~AFHFreeEnergyTest_Chain1_Test(AFHFreeEnergyTest_Chain1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AFHFreeEnergyTest, Chain1) {
  std::cout << std::scientific << std::setprecision(16);
  afh::free_energy::chain::finite solver(6);
  double t = 0.1;
  double eps = 1.0e-10;
  EXPECT_NEAR(-0.467129272955, solver.gs_energy(), eps);
  EXPECT_NEAR( 0.684741648982, solver.gap(), eps);
  double f, e, s;
  std::tie(f, e, s) = solver.free_energy(t);
  EXPECT_NEAR(-0.467182360817, f, eps);
  EXPECT_NEAR(-0.466765889271, e, eps);
  EXPECT_NEAR( 0.004164715458, s, eps);
}